

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O1

void usage(char *progname,char *reason)

{
  FILE *__stream;
  int iVar1;
  undefined8 *puVar2;
  long lVar3;
  
  if (reason == (char *)0x0) {
    puVar2 = (undefined8 *)&stdout;
  }
  else {
    puVar2 = (undefined8 *)&stderr;
  }
  __stream = (FILE *)*puVar2;
  fprintf(__stream,
          "usage: %s [-ceghnrst] [-l len] [-o offset] archive command1 [args] [command2 [args] ...]\n"
          ,progname);
  if (reason == (char *)0x0) {
    fwrite("\nSupported options are:\n\t-c\t\tcheck consistency\n\t-e\t\terror if archive already exists (only useful with -n)\n\t-g\t\tguess file name encoding (for stat)\n\t-h\t\tdisplay this usage\n\t-l len\t\tonly use len bytes of file\n\t-n\t\tcreate archive if it doesn\'t exist\n\t-o offset\tstart reading file at offset\n\t-r\t\tprint raw file name encoding without translation (for stat)\n\t-s\t\tfollow file name convention strictly (for stat)\n\t-t\t\tdisregard current archive contents, if any\n"
           ,0x1c5,1,__stream);
    fwrite("\nSupported commands and arguments are:\n",0x27,1,__stream);
    lVar3 = 0x18;
    do {
      fprintf(__stream,"\t%s %s\n\t    %s\n\n",*(undefined8 *)(lVar3 + 0x10a228),
              *(undefined8 *)((long)&__dso_handle + lVar3),
              *(undefined8 *)((long)&dispatch_table[0].cmdline_name + lVar3));
      lVar3 = lVar3 + 0x28;
    } while (lVar3 != 0x4a0);
    fwrite("\nSupported flags are:\n\t0\t(no flags)\n\tC\tZIP_FL_NOCASE\n\tc\tZIP_FL_CENTRAL\n\td\tZIP_FL_NODIR\n\tl\tZIP_FL_LOCAL\n\tu\tZIP_FL_UNCHANGED\n"
           ,0x7b,1,__stream);
    fwrite("\nSupported compression methods are:\n\tdefault\n",0x2d,1,__stream);
    iVar1 = zip_compression_method_supported(0xc,1);
    if (iVar1 != 0) {
      fwrite("\tbzip2\n",7,1,__stream);
    }
    fwrite("\tdeflate\n\tstore\n",0x10,1,__stream);
    iVar1 = zip_compression_method_supported(0x5f,1);
    if (iVar1 != 0) {
      fwrite("\txz\n",4,1,__stream);
    }
    fwrite("\nSupported encryption methods are:\n\tnone\n",0x29,1,__stream);
    iVar1 = zip_encryption_method_supported(0x101,1);
    if (iVar1 != 0) {
      fwrite("\tAES-128\n",9,1,__stream);
    }
    iVar1 = zip_encryption_method_supported(0x102,1);
    if (iVar1 != 0) {
      fwrite("\tAES-192\n",9,1,__stream);
    }
    iVar1 = zip_encryption_method_supported(0x103,1);
    if (iVar1 != 0) {
      fwrite("\tAES-256\n",9,1,__stream);
    }
    fwrite("\tPKWARE\n",8,1,__stream);
    fwrite("\nThe index is zero-based.\n",0x1a,1,__stream);
    exit(0);
  }
  fprintf(__stream,"%s\n",reason);
  exit(1);
}

Assistant:

static void
usage(const char *progname, const char *reason) {
    unsigned int i;
    FILE *out;
    if (reason == NULL)
	out = stdout;
    else
	out = stderr;
    fprintf(out, "usage: %s [-ceghnrst]" USAGE_REGRESS " [-l len] [-o offset] archive command1 [args] [command2 [args] ...]\n", progname);
    if (reason != NULL) {
	fprintf(out, "%s\n", reason);
	exit(1);
    }

    fprintf(out, "\nSupported options are:\n"
		 "\t-c\t\tcheck consistency\n"
		 "\t-e\t\terror if archive already exists (only useful with -n)\n"
#ifdef FOR_REGRESS
		 "\t-F size\t\tfragment size for in memory archive\n"
#endif
		 "\t-g\t\tguess file name encoding (for stat)\n"
#ifdef FOR_REGRESS
		 "\t-H\t\twrite files with holes compactly\n"
#endif
		 "\t-h\t\tdisplay this usage\n"
		 "\t-l len\t\tonly use len bytes of file\n"
#ifdef FOR_REGRESS
		 "\t-m\t\tread archive into memory, and modify there; write out at end\n"
#endif
		 "\t-n\t\tcreate archive if it doesn't exist\n"
		 "\t-o offset\tstart reading file at offset\n"
		 "\t-r\t\tprint raw file name encoding without translation (for stat)\n"
		 "\t-s\t\tfollow file name convention strictly (for stat)\n"
		 "\t-t\t\tdisregard current archive contents, if any\n");
    fprintf(out, "\nSupported commands and arguments are:\n");
    for (i = 0; i < sizeof(dispatch_table) / sizeof(dispatch_table_t); i++) {
	fprintf(out, "\t%s %s\n\t    %s\n\n", dispatch_table[i].cmdline_name, dispatch_table[i].arg_names, dispatch_table[i].description);
    }
    fprintf(out, "\nSupported flags are:\n"
	    "\t0\t(no flags)\n"
	    "\tC\tZIP_FL_NOCASE\n"
	    "\tc\tZIP_FL_CENTRAL\n"
	    "\td\tZIP_FL_NODIR\n"
	    "\tl\tZIP_FL_LOCAL\n"
	    "\tu\tZIP_FL_UNCHANGED\n");
    fprintf(out, "\nSupported compression methods are:\n"
	    "\tdefault\n");
    if (zip_compression_method_supported(ZIP_CM_BZIP2, 1)) {
	fprintf(out, "\tbzip2\n");
    }
    fprintf(out, "\tdeflate\n"
	    "\tstore\n");
    if (zip_compression_method_supported(ZIP_CM_XZ, 1)) {
	fprintf(out, "\txz\n");
    }
    fprintf(out, "\nSupported encryption methods are:\n"
	    "\tnone\n");
    if (zip_encryption_method_supported(ZIP_EM_AES_128, 1)) {
	fprintf(out, "\tAES-128\n");
    }
    if (zip_encryption_method_supported(ZIP_EM_AES_192, 1)) {
	fprintf(out, "\tAES-192\n");
    }
    if (zip_encryption_method_supported(ZIP_EM_AES_256, 1)) {
	fprintf(out, "\tAES-256\n");
    }
    fprintf(out, "\tPKWARE\n");
    fprintf(out, "\nThe index is zero-based.\n");
    exit(0);
}